

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::rleAc
          (LossyDctEncoderBase *this,half *block,unsigned_short **acPtr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_short *puVar4;
  unsigned_short uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  puVar4 = *acPtr;
  iVar1 = this->_numAcComp;
  iVar2 = 1;
  do {
    uVar5 = block[iVar2]._h;
    if (uVar5 == 0) {
      iVar7 = iVar2 + 1;
      if (iVar2 < 0x3f) {
        iVar3 = 0x40 - iVar2;
        lVar8 = 0;
        do {
          iVar6 = (int)lVar8;
          if (block[iVar7 + iVar6]._h != 0) {
            iVar7 = iVar7 + iVar6;
            iVar3 = iVar6 + 1;
            goto LAB_00578cad;
          }
          lVar8 = lVar8 + 1;
        } while (0x3f - (long)iVar2 != lVar8);
        iVar7 = 0x40;
      }
      else {
        iVar3 = 1;
      }
LAB_00578cad:
      uVar5 = 0;
      iVar6 = 1;
      if ((iVar3 != 1) && (uVar5 = 0xff00, iVar6 = iVar3, iVar7 != 0x40)) {
        uVar5 = (ushort)iVar3 | 0xff00;
      }
      *acPtr = puVar4 + 1;
      *puVar4 = uVar5;
      this->_numAcComp = iVar1 + 1;
      iVar2 = iVar6 + iVar2;
    }
    else {
      *acPtr = puVar4 + 1;
      *puVar4 = uVar5;
      this->_numAcComp = iVar1 + 1;
      iVar2 = iVar2 + 1;
    }
    iVar1 = iVar1 + 1;
    puVar4 = puVar4 + 1;
    if (0x3f < iVar2) {
      return;
    }
  } while( true );
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::rleAc
    (half *block,
     unsigned short *&acPtr)
{
    int dctComp              = 1; 
    unsigned short rleSymbol = 0x0;

    while (dctComp < 64)
    {
        int runLen = 1;
    
        //
        // If we don't have a 0, output verbatim
        //

        if (block[dctComp].bits() != rleSymbol)
        {
            *acPtr++ =  block[dctComp].bits();
            _numAcComp++;

            dctComp += runLen;
            continue;
        }

        //
        // We're sitting on a 0, so see how big the run is.
        //

        while ((dctComp+runLen < 64) && 
               (block[dctComp+runLen].bits() == rleSymbol))
        {
            runLen++;
        }

        //
        // If the run len is too small, just output verbatim
        // otherwise output our run token
        //
        // Originally, we wouldn't have a separate symbol for
        // "end of block". But in some experimentation, it looks
        // like using 0xff00 for "end of block" can save a bit
        // of space. 
        //

        if (runLen == 1)
        {
            runLen           = 1;
            *acPtr++ = block[dctComp].bits();
            _numAcComp++;

            //
            // Using 0xff00 for "end of block"
            //
        }
        else if (runLen + dctComp == 64)
        {
            //
            // Signal EOB
            //

            *acPtr++ = 0xff00;
            _numAcComp++;
        }
        else
        {
            // 
            // Signal normal run
            //

            *acPtr++   = 0xff00 | runLen;
            _numAcComp++;
        }

        //
        // Advance by runLen
        //

        dctComp += runLen;
    }
}